

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<float> *value)

{
  bool bVar1;
  optional<float> local_30;
  float local_28 [2];
  float v;
  optional<float> *value_local;
  AsciiParser *this_local;
  
  _v = value;
  value_local = (optional<float> *)this;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<float>::operator=(_v);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,local_28);
    if (bVar1) {
      nonstd::optional_lite::optional<float>::optional<float_&,_0>(&local_30,local_28);
      nonstd::optional_lite::optional<float>::operator=(_v,&local_30);
      nonstd::optional_lite::optional<float>::~optional(&local_30);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<float> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  float v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}